

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int is_shorter_gf_interval_better(AV1_COMP *cpi,EncodeFrameParams *frame_params)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *extraout_RAX;
  AV1_PRIMARY *pAVar3;
  byte bVar4;
  bool bVar5;
  
  pAVar3 = cpi->ppi;
  iVar2 = (cpi->sf).tpl_sf.gop_length_decision_method;
  av1_tpl_preload_rc_estimate(cpi,frame_params);
  if (iVar2 == 2) {
    uVar1 = 0;
    if ((double)(pAVar3->p_rc).gfu_boost <
        (double)((pAVar3->p_rc).num_stats_used_for_gfu_boost * 0x32) * 1.4) {
      iVar2 = av1_tpl_setup_stats(cpi,3,frame_params);
      uVar1 = (uint)(iVar2 == 0);
    }
  }
  else {
    if ((cpi->rc).frames_since_key < 1) {
      bVar4 = 1;
      pAVar3 = extraout_RAX;
    }
    else {
      pAVar3 = cpi->ppi;
      bVar4 = (byte)((uint)(pAVar3->gf_group).arf_index >> 0x1f);
    }
    uVar1 = (uint)pAVar3;
    if (iVar2 == 1) {
      iVar2 = av1_tpl_setup_stats(cpi,2,frame_params);
      bVar5 = iVar2 != 2;
      uVar1 = (uint)(iVar2 == 0);
    }
    else {
      bVar5 = false;
    }
    if (!bVar5) {
      iVar2 = av1_tpl_setup_stats(cpi,1,frame_params);
      uVar1 = (uint)(iVar2 == 0);
      if (bVar4 == 0 && iVar2 != 0) {
        cpi->skip_tpl_setup_stats = 1;
      }
    }
  }
  return uVar1;
}

Assistant:

static int is_shorter_gf_interval_better(
    AV1_COMP *cpi, const EncodeFrameParams *frame_params) {
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int gop_length_decision_method = cpi->sf.tpl_sf.gop_length_decision_method;
  int shorten_gf_interval;

  av1_tpl_preload_rc_estimate(cpi, frame_params);

  if (gop_length_decision_method == 2) {
    // GF group length is decided based on GF boost and tpl stats of ARFs from
    // base layer, (base+1) layer.
    shorten_gf_interval =
        (p_rc->gfu_boost <
         p_rc->num_stats_used_for_gfu_boost * GF_MIN_BOOST * 1.4) &&
        !av1_tpl_setup_stats(cpi, 3, frame_params);
  } else {
    int do_complete_tpl = 1;
    GF_GROUP *const gf_group = &cpi->ppi->gf_group;
    int is_temporal_filter_enabled =
        (rc->frames_since_key > 0 && gf_group->arf_index > -1);

    if (gop_length_decision_method == 1) {
      // Check if tpl stats of ARFs from base layer, (base+1) layer,
      // (base+2) layer can decide the GF group length.
      int gop_length_eval = av1_tpl_setup_stats(cpi, 2, frame_params);

      if (gop_length_eval != 2) {
        do_complete_tpl = 0;
        shorten_gf_interval = !gop_length_eval;
      }
    }

    if (do_complete_tpl) {
      // Decide GF group length based on complete tpl stats.
      shorten_gf_interval = !av1_tpl_setup_stats(cpi, 1, frame_params);
      // Tpl stats is reused when the ARF is temporally filtered and GF
      // interval is not shortened.
      if (is_temporal_filter_enabled && !shorten_gf_interval) {
        cpi->skip_tpl_setup_stats = 1;
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
        assert(cpi->gf_frame_index == 0);
        av1_vbr_rc_update_q_index_list(&cpi->vbr_rc_info, &cpi->ppi->tpl_data,
                                       gf_group,
                                       cpi->common.seq_params->bit_depth);
#endif  // CONFIG_BITRATE_ACCURACY
      }
    }
  }
  return shorten_gf_interval;
}